

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_b44.c
# Opt level: O3

exr_result_t
internal_exr_undo_b44
          (exr_decode_pipeline_t *decode,void *compressed_data,uint64_t comp_buf_size,
          void *uncompressed_data,uint64_t uncompressed_size)

{
  exr_result_t eVar1;
  uint64_t newsz;
  
  newsz = compute_scratch_buffer_size(decode,uncompressed_size);
  eVar1 = internal_decode_alloc_buffer
                    (decode,EXR_TRANSCODE_BUFFER_SCRATCH1,&decode->scratch_buffer_1,
                     &decode->scratch_alloc_size_1,newsz);
  if (eVar1 != 0) {
    return eVar1;
  }
  eVar1 = uncompress_b44_impl(decode,compressed_data,comp_buf_size,uncompressed_data,
                              uncompressed_size);
  return eVar1;
}

Assistant:

exr_result_t
internal_exr_undo_b44 (
    exr_decode_pipeline_t* decode,
    const void*            compressed_data,
    uint64_t               comp_buf_size,
    void*                  uncompressed_data,
    uint64_t               uncompressed_size)
{
    exr_result_t rv;
    rv = internal_decode_alloc_buffer (
        decode,
        EXR_TRANSCODE_BUFFER_SCRATCH1,
        &(decode->scratch_buffer_1),
        &(decode->scratch_alloc_size_1),
        compute_scratch_buffer_size (decode, uncompressed_size));
    if (rv != EXR_ERR_SUCCESS) return rv;

    return uncompress_b44_impl (
        decode,
        compressed_data,
        comp_buf_size,
        uncompressed_data,
        uncompressed_size);
}